

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::FunctionalTest::PrepareOutputBuffer(FunctionalTest *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *pTVar3;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  undefined4 *puVar6;
  MessageBuilder local_630;
  MessageBuilder local_4b0;
  MessageBuilder local_330;
  MessageBuilder local_1a0;
  long local_20;
  Functions *gl;
  FunctionalTest *this_local;
  
  gl = (Functions *)this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_20 = CONCAT44(extraout_var,iVar1);
  (**(code **)(local_20 + 0x6c8))(1,&this->m_bo_out);
  iVar1 = (**(code **)(local_20 + 0x800))();
  if (iVar1 != 0) {
    pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar4 = tcu::TestContext::getLog(pTVar3);
    tcu::TestLog::operator<<(&local_630,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar5 = tcu::MessageBuilder::operator<<(&local_630,(char (*) [23])"GenBuffers has failed.");
    tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_630);
    puVar6 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar6 = 0;
    __cxa_throw(puVar6,&int::typeinfo,0);
  }
  (**(code **)(local_20 + 0x40))(0x8c8e,this->m_bo_out);
  iVar1 = (**(code **)(local_20 + 0x800))();
  if (iVar1 == 0) {
    (*this->m_pNamedBufferData)(this->m_bo_out,0x1c,s_initial_data_b,0x88ea);
    iVar1 = (**(code **)(local_20 + 0x800))();
    if (iVar1 == 0) {
      (**(code **)(local_20 + 0x50))(0x8c8e,0,this->m_bo_out,0,0x18);
      iVar1 = (**(code **)(local_20 + 0x800))();
      if (iVar1 != 0) {
        pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar4 = tcu::TestContext::getLog(pTVar3);
        tcu::TestLog::operator<<(&local_1a0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_1a0,(char (*) [28])"BindBufferRange has failed.");
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1a0);
        puVar6 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar6 = 0;
        __cxa_throw(puVar6,&int::typeinfo,0);
      }
      this_local._7_1_ = true;
    }
    else {
      pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      pTVar4 = tcu::TestContext::getLog(pTVar3);
      tcu::TestLog::operator<<(&local_330,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar5 = tcu::MessageBuilder::operator<<
                         (&local_330,(char (*) [28])"NamedBufferData has failed.");
      tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_330);
      this_local._7_1_ = false;
    }
    return this_local._7_1_;
  }
  pTVar3 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  pTVar4 = tcu::TestContext::getLog(pTVar3);
  tcu::TestLog::operator<<(&local_4b0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_4b0,(char (*) [23])"BindBuffer has failed.");
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_4b0);
  puVar6 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar6 = 0;
  __cxa_throw(puVar6,&int::typeinfo,0);
}

Assistant:

bool FunctionalTest::PrepareOutputBuffer()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Buffer preparation */
	gl.genBuffers(1, &m_bo_out);

	if (GL_NO_ERROR == gl.getError())
	{
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_out);

		if (GL_NO_ERROR == gl.getError())
		{
			m_pNamedBufferData(m_bo_out, sizeof(s_initial_data_b), s_initial_data_b, GL_DYNAMIC_COPY);

			if (GL_NO_ERROR == gl.getError())
			{
				gl.bindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_bo_out, 0,
								   sizeof(s_initial_data_a) /* intentionally sizeof(a) < sizeof(b) */);

				if (GL_NO_ERROR == gl.getError())
				{
					return true;
				}
				else
				{
					m_context.getTestContext().getLog() << tcu::TestLog::Message << "BindBufferRange has failed."
														<< tcu::TestLog::EndMessage;
					throw 0; /* This function is not being tested, throw test internal error */
				}
			}
			else
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message << "NamedBufferData has failed."
													<< tcu::TestLog::EndMessage;
			}
		}
		else
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "BindBuffer has failed."
												<< tcu::TestLog::EndMessage;
			throw 0; /* This function is not being tested, throw test internal error */
		}
	}
	else
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "GenBuffers has failed."
											<< tcu::TestLog::EndMessage;
		throw 0; /* This function is not being tested, throw test internal error */
	}

	return false;
}